

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O1

int Test_N_VWSqrSumMaskLocal(N_Vector X,N_Vector W,N_Vector ID,sunindextype param_4,int myid)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  double __x;
  double dVar5;
  double dVar6;
  timespec spec;
  timespec local_40;
  
  __x = (double)myid;
  dVar6 = 0.0;
  if (0 < myid) {
    if (__x < 0.0) {
      dVar6 = sqrt(__x);
    }
    else {
      dVar6 = SQRT(__x);
    }
  }
  dVar5 = 0.0;
  lVar2 = param_4 + -1;
  if (1 < param_4) {
    dVar5 = (double)lVar2;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
  }
  set_element_range(X,0,lVar2,dVar6);
  set_element_range(W,0,lVar2,1.0 / dVar5);
  N_VConst(0x3ff0000000000000,ID);
  set_element(ID,lVar2,0.0);
  iVar4 = 1;
  clock_gettime(1,&local_40);
  lVar2 = local_40.tv_sec - base_time_tv_sec;
  dVar5 = (double)local_40.tv_nsec;
  dVar6 = (double)N_VWSqrSumMaskLocal(X,W,ID);
  sync_device(X);
  clock_gettime(1,&local_40);
  lVar3 = local_40.tv_sec - base_time_tv_sec;
  if (0.0 <= dVar6) {
    iVar1 = SUNRCompareTol(dVar6,__x,0x3e50000000000000);
    if (iVar1 == 0) {
      iVar4 = 0;
      if (myid == 0) {
        puts("PASSED test -- N_VWSqrSumMaskLocal");
      }
      goto LAB_0010f313;
    }
  }
  printf(">>> FAILED test -- N_VWSqrSumMaskLocal, Proc %d\n",(ulong)(uint)myid);
LAB_0010f313:
  max_time(X,((double)local_40.tv_nsec / 1000000000.0 + (double)lVar3) -
             (dVar5 / 1000000000.0 + (double)lVar2));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VWSqrSumMaskLocal");
  }
  return iVar4;
}

Assistant:

int Test_N_VWSqrSumMaskLocal(N_Vector X, N_Vector W, N_Vector ID,
                             sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunrealtype ans, xval, wval;

  /* fill vector data */
  xval = SUNRsqrt(myid);
  wval = ONE / SUNRsqrt(local_length - 1);
  set_element_range(X, 0, local_length - 1, xval);
  set_element_range(W, 0, local_length - 1, wval);

  /* use all elements except one */
  N_VConst(ONE, ID);
  set_element(ID, local_length - 1, ZERO);

  start_time = get_time();
  ans        = N_VWSqrSumMaskLocal(X, W, ID);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal myid */
  failure = (ans < ZERO) ? 1
                         : SUNRCompareTol(ans, (sunrealtype)myid,
                                          SUNRsqrt(SUN_UNIT_ROUNDOFF));

  if (failure)
  {
    printf(">>> FAILED test -- N_VWSqrSumMaskLocal, Proc %d\n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VWSqrSumMaskLocal\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VWSqrSumMaskLocal", maxt);

  return (fails);
}